

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O1

int queryIntItem(void *userData,char *queryItemKey,size_t queryItemKeyLen,long queryItemValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  uint uVar5;
  IContext *pIVar6;
  undefined4 extraout_var;
  ExpressionResultBuilder *pEVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *pmVar8;
  undefined8 uVar9;
  AssertionInfo __assertionInfo194;
  long *local_340;
  long local_338;
  long local_330 [2];
  string local_320;
  string local_300;
  mapped_type local_2e0;
  char *local_2d8;
  AssertionInfo local_2d0;
  void *local_260;
  ExpressionResultBuilder local_258;
  
  paVar1 = &local_320.field_2;
  local_320._M_dataplus._M_p = (pointer)paVar1;
  local_2e0 = queryItemValue;
  local_2d8 = queryItemKey;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CAPTURE","");
  local_340 = local_330;
  local_260 = userData;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_340,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
             ,"");
  paVar3 = &local_258.m_data.reconstructedExpression.field_2;
  local_258.m_data.reconstructedExpression._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_340,local_338 + (long)local_340);
  local_258.m_data.message._M_dataplus._M_p = (pointer)0xc2;
  paVar2 = &local_300.field_2;
  local_300._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"");
  Catch::AssertionInfo::AssertionInfo
            (&local_2d0,&local_320,(SourceLineInfo *)&local_258,&local_300,ContinueOnFailure);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.m_data.reconstructedExpression._M_dataplus._M_p != paVar3) {
    operator_delete(local_258.m_data.reconstructedExpression._M_dataplus._M_p,
                    local_258.m_data.reconstructedExpression.field_2._M_allocated_capacity + 1);
  }
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  pIVar6 = Catch::getCurrentContext();
  iVar4 = (*pIVar6->_vptr_IContext[2])(pIVar6);
  Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258.m_stream,"queryItemKey := ",0x10);
  pEVar7 = Catch::ExpressionResultBuilder::operator<<(&local_258,&local_2d8);
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x40))
                    ((long *)CONCAT44(extraout_var,iVar4),pEVar7,&local_2d0);
  Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
  if ((uVar5 & 4) != 0) {
    uVar9 = __cxa_allocate_exception(1);
    __cxa_throw(uVar9,&Catch::TestFailureException::typeinfo,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.capturedExpression._M_dataplus._M_p != &local_2d0.capturedExpression.field_2) {
    operator_delete(local_2d0.capturedExpression._M_dataplus._M_p,
                    local_2d0.capturedExpression.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.lineInfo.file._M_dataplus._M_p != &local_2d0.lineInfo.file.field_2) {
    operator_delete(local_2d0.lineInfo.file._M_dataplus._M_p,
                    local_2d0.lineInfo.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.macroName._M_dataplus._M_p != &local_2d0.macroName.field_2) {
    operator_delete(local_2d0.macroName._M_dataplus._M_p,
                    local_2d0.macroName.field_2._M_allocated_capacity + 1);
  }
  local_320._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CAPTURE","");
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_340,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
             ,"");
  local_258.m_data.reconstructedExpression._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_340,local_338 + (long)local_340);
  local_258.m_data.message._M_dataplus._M_p = (pointer)0xc3;
  local_300._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"");
  Catch::AssertionInfo::AssertionInfo
            (&local_2d0,&local_320,(SourceLineInfo *)&local_258,&local_300,ContinueOnFailure);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.m_data.reconstructedExpression._M_dataplus._M_p != paVar3) {
    operator_delete(local_258.m_data.reconstructedExpression._M_dataplus._M_p,
                    local_258.m_data.reconstructedExpression.field_2._M_allocated_capacity + 1);
  }
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  pIVar6 = Catch::getCurrentContext();
  iVar4 = (*pIVar6->_vptr_IContext[2])(pIVar6);
  Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258.m_stream,"queryItemKeyLen := ",0x13);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_258.m_stream);
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x40))
                    ((long *)CONCAT44(extraout_var_00,iVar4),&local_258,&local_2d0);
  Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
  if ((uVar5 & 4) != 0) {
    uVar9 = __cxa_allocate_exception(1);
    __cxa_throw(uVar9,&Catch::TestFailureException::typeinfo,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.capturedExpression._M_dataplus._M_p != &local_2d0.capturedExpression.field_2) {
    operator_delete(local_2d0.capturedExpression._M_dataplus._M_p,
                    local_2d0.capturedExpression.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.lineInfo.file._M_dataplus._M_p != &local_2d0.lineInfo.file.field_2) {
    operator_delete(local_2d0.lineInfo.file._M_dataplus._M_p,
                    local_2d0.lineInfo.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.macroName._M_dataplus._M_p != &local_2d0.macroName.field_2) {
    operator_delete(local_2d0.macroName._M_dataplus._M_p,
                    local_2d0.macroName.field_2._M_allocated_capacity + 1);
  }
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CAPTURE","");
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_340,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
             ,"");
  local_258.m_data.reconstructedExpression._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_340,local_338 + (long)local_340);
  local_258.m_data.message._M_dataplus._M_p = (pointer)0xc4;
  local_300._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"");
  Catch::AssertionInfo::AssertionInfo
            (&local_2d0,&local_320,(SourceLineInfo *)&local_258,&local_300,ContinueOnFailure);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.m_data.reconstructedExpression._M_dataplus._M_p != paVar3) {
    operator_delete(local_258.m_data.reconstructedExpression._M_dataplus._M_p,
                    local_258.m_data.reconstructedExpression.field_2._M_allocated_capacity + 1);
  }
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  pIVar6 = Catch::getCurrentContext();
  iVar4 = (*pIVar6->_vptr_IContext[2])(pIVar6);
  Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258.m_stream,"queryItemValue := ",0x12);
  std::ostream::_M_insert<long>((long)&local_258.m_stream);
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x40))
                    ((long *)CONCAT44(extraout_var_01,iVar4),&local_258,&local_2d0);
  Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
  if ((uVar5 & 4) == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.capturedExpression._M_dataplus._M_p != &local_2d0.capturedExpression.field_2) {
      operator_delete(local_2d0.capturedExpression._M_dataplus._M_p,
                      local_2d0.capturedExpression.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.lineInfo.file._M_dataplus._M_p != &local_2d0.lineInfo.file.field_2) {
      operator_delete(local_2d0.lineInfo.file._M_dataplus._M_p,
                      local_2d0.lineInfo.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.macroName._M_dataplus._M_p != &local_2d0.macroName.field_2) {
      operator_delete(local_2d0.macroName._M_dataplus._M_p,
                      local_2d0.macroName.field_2._M_allocated_capacity + 1);
    }
    local_258.m_data.reconstructedExpression._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,local_2d8,local_2d8 + queryItemKeyLen);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                           *)((long)local_260 + 0x150),(key_type *)&local_258);
    *pmVar8 = local_2e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258.m_data.reconstructedExpression._M_dataplus._M_p != paVar3) {
      operator_delete(local_258.m_data.reconstructedExpression._M_dataplus._M_p,
                      local_258.m_data.reconstructedExpression.field_2._M_allocated_capacity + 1);
    }
    return 1;
  }
  uVar9 = __cxa_allocate_exception(1);
  __cxa_throw(uVar9,&Catch::TestFailureException::typeinfo,0);
}

Assistant:

inline int queryIntItem(void* userData, const char* queryItemKey, size_t queryItemKeyLen, long int queryItemValue)
{
    CAPTURE(queryItemKey);
    CAPTURE(queryItemKeyLen);
    CAPTURE(queryItemValue);
    static_cast<URI*>(userData)->queryIntItems[std::string(queryItemKey,queryItemKeyLen)] = queryItemValue;
    return 1;
}